

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr
          (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *this,FenceSync *ptr)

{
  FenceSync *pFVar1;
  SharedPtrState<deqp::egl::GLES2ThreadTest::FenceSync,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::FenceSync>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::FenceSync> local_25 [13];
  FenceSync *local_18;
  FenceSync *ptr_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *this_local;
  
  this->m_ptr = (FenceSync *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (FenceSync *)this;
  pSVar2 = (SharedPtrState<deqp::egl::GLES2ThreadTest::FenceSync,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::FenceSync>_>
            *)operator_new(0x20);
  pFVar1 = local_18;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::FenceSync>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::GLES2ThreadTest::FenceSync,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::FenceSync>_>
  ::SharedPtrState(pSVar2,pFVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}